

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

string_view __thiscall
absl::cord_internal::CordRepBtree::AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,string_view data,size_t extra)

{
  byte bVar1;
  byte bVar2;
  CordRep *pCVar3;
  sbyte sVar4;
  ulong uVar5;
  CordRep **ppCVar6;
  char *__src;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  string_view sVar10;
  
  __src = data._M_str;
  uVar9 = data._M_len;
  if (uVar9 == 0) {
    __assert_fail("!data.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x23e,
                  "absl::string_view absl::cord_internal::CordRepBtree::AddData(absl::string_view, size_t)"
                 );
  }
  bVar1 = (this->super_CordRep).storage[2];
  bVar2 = (this->super_CordRep).storage[1];
  uVar8 = (ulong)bVar2;
  uVar5 = bVar1 - uVar8;
  if (uVar5 < 6) {
    if (uVar8 != 0) {
      (this->super_CordRep).storage[1] = '\0';
      (this->super_CordRep).storage[2] = (uint8_t)uVar5;
      if (bVar1 != bVar2) {
        ppCVar6 = this->edges_;
        do {
          *ppCVar6 = ppCVar6[uVar8];
          ppCVar6 = ppCVar6 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
    do {
      pCVar3 = &CordRepFlat::NewImpl<4096ul>(uVar9 + extra)->super_CordRep;
      bVar1 = pCVar3->tag;
      iVar7 = -0xb8000;
      if (bVar1 < 0xbb) {
        iVar7 = -0xe80;
      }
      sVar4 = 0xc;
      if (bVar1 < 0xbb) {
        sVar4 = 6;
      }
      if (bVar1 < 0x43) {
        iVar7 = -0x10;
        sVar4 = 3;
      }
      uVar8 = (ulong)(int)(((uint)bVar1 << sVar4) + iVar7 + -0xd);
      if (uVar9 < uVar8) {
        uVar8 = uVar9;
      }
      ((CordRep *)&pCVar3->length)->length = uVar8;
      bVar1 = (this->super_CordRep).storage[2];
      (this->super_CordRep).storage[2] = bVar1 + 1;
      this->edges_[bVar1] = pCVar3;
      memcpy(pCVar3->storage,__src,uVar8);
      __src = __src + uVar8;
      uVar9 = uVar9 - uVar8;
    } while ((uVar9 != 0) && ((this->super_CordRep).storage[2] != '\x06'));
    sVar10._M_str = __src;
    sVar10._M_len = uVar9;
    return sVar10;
  }
  __assert_fail("size() < capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x23f,
                "absl::string_view absl::cord_internal::CordRepBtree::AddData(absl::string_view, size_t)"
               );
}

Assistant:

inline bool owned(int depth) const { return depth < share_depth; }